

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O3

void __thiscall
fizplex::SimplexTest_EqualityRowBoundedVarsOptimalSolution_Test::
~SimplexTest_EqualityRowBoundedVarsOptimalSolution_Test
          (SimplexTest_EqualityRowBoundedVarsOptimalSolution_Test *this)

{
  pointer pRVar1;
  pointer pCVar2;
  
  (this->super_SimplexTest).super_Test._vptr_Test = (_func_int **)&PTR__SimplexTest_001c1c60;
  operator_delete((this->super_SimplexTest).x.vals._M_data);
  pRVar1 = (this->super_SimplexTest).lp.rows.
           super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pRVar1 != (pointer)0x0) {
    operator_delete(pRVar1,(long)(this->super_SimplexTest).lp.rows.
                                 super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar1);
  }
  pCVar2 = (this->super_SimplexTest).lp.cols.
           super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pCVar2 != (pointer)0x0) {
    operator_delete(pCVar2,(long)(this->super_SimplexTest).lp.cols.
                                 super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar2);
  }
  operator_delete((this->super_SimplexTest).lp.c.vals._M_data);
  operator_delete((this->super_SimplexTest).lp.b.vals._M_data);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector
            ((vector<fizplex::SVector,_std::allocator<fizplex::SVector>_> *)
             &(this->super_SimplexTest).lp);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

TEST_F(SimplexTest, EqualityRowBoundedVarsOptimalSolution) {
  lp.add_column(ColType::Bounded, 0, 5, -1);
  lp.add_column(ColType::Bounded, 0, 5, 0);
  lp.add_row(RowType::Equality, 0, 0, {1, -1});

  solve_lp();
  EXPECT_EQ(Simplex::Result::OptimalSolution, result);
  EXPECT_DOUBLE_EQ(-5.0, z);
  EXPECT_EQ(DVector({5.0, 5.0, 0.0}), x);
}